

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealer.cpp
# Opt level: O2

Block * __thiscall Sealer::Upchain(Block *__return_storage_ptr__,Sealer *this,Blockchain *bc)

{
  size_t sVar1;
  allocator local_171;
  string local_170;
  Block local_150;
  Block local_b8;
  
  sVar1 = Blockchain::GetBlockIndex(bc);
  std::__cxx11::string::string((string *)&local_150,anon_var_dwarf_2e23b + 0xc,&local_171);
  std::__cxx11::string::string((string *)&local_170,(string *)&this->merkle_root);
  Block::Block(__return_storage_ptr__,(uint32_t)sVar1,&local_150.bPrevHash,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  Block::Block(&local_b8,__return_storage_ptr__);
  Blockchain::AddBlock(&local_150,bc,&local_b8);
  Block::operator=(__return_storage_ptr__,&local_150);
  Block::~Block(&local_150);
  Block::~Block(&local_b8);
  Blockchain::BlockIndexAdd(bc);
  return __return_storage_ptr__;
}

Assistant:

Block Sealer::Upchain(Blockchain & bc) {
        Block bNew = Block(bc.GetBlockIndex(),"",merkle_root);
        bNew = bc.AddBlock(bNew);
        bc.BlockIndexAdd();
        return bNew;
}